

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O3

void gravity_function_dump(gravity_function_t *f,code_dump_function codef)

{
  uint32_t *puVar1;
  gravity_value_r r;
  gravity_value_r r_00;
  gravity_value_r r_01;
  gravity_value_t *unaff_RBX;
  char *pcVar2;
  gravity_exec_type gVar3;
  void *pvVar4;
  undefined8 in_stack_ffffffffffffffe0;
  
  pcVar2 = "$anon";
  if (f->identifier != (char *)0x0) {
    pcVar2 = f->identifier;
  }
  gVar3 = EXEC_TYPE_NATIVE;
  printf("Function: %s\n",pcVar2);
  pvVar4 = f->xdata;
  printf("Params:%d Locals:%d Temp:%d Upvalues:%d Tag:%d xdata:%p\n",(ulong)f->nparams,
         (ulong)f->nlocals,(ulong)f->ntemps,(ulong)f->nupvalues,(ulong)f->tag);
  if (f->tag == EXEC_TYPE_NATIVE) {
    if ((f->field_9).field_0.cpool.n != 0) {
      puts("======= CONST POOL =======");
      gVar3 = f->tag;
    }
    r.m = in_stack_ffffffffffffffe0;
    r.n = (size_t)pvVar4;
    r.p = unaff_RBX;
    gravity_function_array_dump((gravity_function_t *)(ulong)gVar3,r);
    if ((f->field_9).field_0.pname.n != 0) {
      puts("======= PARAM NAMES =======");
    }
    r_00.m = in_stack_ffffffffffffffe0;
    r_00.n = (size_t)pvVar4;
    r_00.p = unaff_RBX;
    gravity_function_array_dump((gravity_function_t *)(ulong)f->tag,r_00);
    if ((f->field_9).field_0.pvalue.n != 0) {
      puts("======= PARAM VALUES =======");
    }
    r_01.m = in_stack_ffffffffffffffe0;
    r_01.n = (size_t)pvVar4;
    r_01.p = unaff_RBX;
    gravity_function_array_dump((gravity_function_t *)(ulong)f->tag,r_01);
    puts("======= BYTECODE =======");
    puVar1 = (f->field_9).field_0.bytecode;
    if (codef != (code_dump_function)0x0 && puVar1 != (uint32_t *)0x0) {
      (*codef)(puVar1);
    }
  }
  putchar(10);
  return;
}

Assistant:

void gravity_function_dump (gravity_function_t *f, code_dump_function codef) {
    printf("Function: %s\n", (f->identifier) ? f->identifier : "$anon");
    printf("Params:%d Locals:%d Temp:%d Upvalues:%d Tag:%d xdata:%p\n", f->nparams, f->nlocals, f->ntemps, f->nupvalues, f->tag, f->xdata);

    if (f->tag == EXEC_TYPE_NATIVE) {
        if (marray_size(f->cpool)) printf("======= CONST POOL =======\n");
        gravity_function_array_dump(f, f->cpool);
        
        if (marray_size(f->pname)) printf("======= PARAM NAMES =======\n");
        gravity_function_array_dump(f, f->pname);
        
        if (marray_size(f->pvalue)) printf("======= PARAM VALUES =======\n");
        gravity_function_array_dump(f, f->pvalue);

        printf("======= BYTECODE =======\n");
        if ((f->bytecode) && (codef)) codef(f->bytecode);
    }

    printf("\n");
}